

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall
S2Builder::AddSnappedEdges
          (S2Builder *this,InputEdgeId begin,InputEdgeId end,GraphOptions *options,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
          vector<int,_std::allocator<int>_> *input_edge_ids,IdSetLexicon *input_edge_id_set_lexicon,
          vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
          *site_vertices)

{
  DegenerateEdges DVar1;
  pointer ppVar2;
  int32 id;
  ostream *poVar3;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *points;
  int i;
  ulong uVar4;
  long lVar5;
  pointer ppVar6;
  vector<int,_std::allocator<int>_> chain;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> v;
  string local_50;
  
  DVar1 = options->degenerate_edges_;
  chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  for (lVar5 = (long)begin; lVar5 < end; lVar5 = lVar5 + 1) {
    id = IdSetLexicon::AddSingleton(input_edge_id_set_lexicon,(int32)lVar5);
    SnapEdge(this,(int32)lVar5,&chain);
    MaybeAddInputVertex(this,(this->input_edges_).
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar5].first,
                        *chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,site_vertices);
    if ((long)chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start == 4) {
      if (DVar1 != DISCARD) {
        AddSnappedEdge(this,*chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,
                       *chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,id,options->edge_type_,edges,input_edge_ids
                      );
      }
    }
    else {
      MaybeAddInputVertex(this,(this->input_edges_).
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar5].second,
                          chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1],site_vertices);
      for (uVar4 = 1;
          uVar4 < (ulong)((long)chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
        AddSnappedEdge(this,chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar4 - 1],
                       chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar4],id,options->edge_type_,edges,
                       input_edge_ids);
      }
    }
  }
  if (s2builder_verbose != false) {
    ppVar2 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar6 = (edges->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar2; ppVar6 = ppVar6 + 1) {
      v.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      v.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      v.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
                (&v,(this->sites_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_start + ppVar6->first);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
                (&v,(this->sites_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_start + ppVar6->second);
      poVar3 = std::operator<<((ostream *)&std::cout,"S2Polyline: ");
      s2textformat::ToString_abi_cxx11_(&local_50,(s2textformat *)&v,points);
      poVar3 = std::operator<<(poVar3,(string *)&local_50);
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppVar6->first);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppVar6->second);
      poVar3 = std::operator<<(poVar3,")");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_50);
      std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base
                ((_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&v);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&chain.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void S2Builder::AddSnappedEdges(
    InputEdgeId begin, InputEdgeId end, const GraphOptions& options,
    vector<Edge>* edges, vector<InputEdgeIdSetId>* input_edge_ids,
    IdSetLexicon* input_edge_id_set_lexicon,
    vector<compact_array<InputVertexId>>* site_vertices) const {
  bool discard_degenerate_edges = (options.degenerate_edges() ==
                                   GraphOptions::DegenerateEdges::DISCARD);
  vector<SiteId> chain;
  for (InputEdgeId e = begin; e < end; ++e) {
    InputEdgeIdSetId id = input_edge_id_set_lexicon->AddSingleton(e);
    SnapEdge(e, &chain);
    MaybeAddInputVertex(input_edges_[e].first, chain[0], site_vertices);
    if (chain.size() == 1) {
      if (discard_degenerate_edges) continue;
      AddSnappedEdge(chain[0], chain[0], id, options.edge_type(),
                     edges, input_edge_ids);
    } else {
      MaybeAddInputVertex(input_edges_[e].second, chain.back(), site_vertices);
      for (int i = 1; i < chain.size(); ++i) {
        AddSnappedEdge(chain[i-1], chain[i], id, options.edge_type(),
                       edges, input_edge_ids);
      }
    }
  }
  if (s2builder_verbose) DumpEdges(*edges, sites_);
}